

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.h
# Opt level: O0

void __thiscall Diligent::SamplerDesc::SamplerDesc(SamplerDesc *this)

{
  Float32 *local_18;
  SamplerDesc *this_local;
  
  DeviceObjectAttribs::DeviceObjectAttribs(&this->super_DeviceObjectAttribs);
  this->MinFilter = FILTER_TYPE_LINEAR;
  this->MagFilter = FILTER_TYPE_LINEAR;
  this->MipFilter = FILTER_TYPE_LINEAR;
  this->AddressU = TEXTURE_ADDRESS_CLAMP;
  this->AddressV = TEXTURE_ADDRESS_CLAMP;
  this->AddressW = TEXTURE_ADDRESS_CLAMP;
  this->Flags = SAMPLER_FLAG_NONE;
  this->UnnormalizedCoords = false;
  this->MipLODBias = 0.0;
  this->MaxAnisotropy = 0;
  this->ComparisonFunc = COMPARISON_FUNC_NEVER;
  local_18 = this->BorderColor;
  do {
    *local_18 = 0.0;
    local_18 = local_18 + 1;
  } while (local_18 != (Float32 *)&this->MinLOD);
  this->MinLOD = 0.0;
  this->MaxLOD = 3.4028235e+38;
  return;
}

Assistant:

constexpr SamplerDesc() noexcept {}